

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseTools.cpp
# Opt level: O3

uint64_t siamese::GetTimeMsec(void)

{
  timeval tv;
  timeval local_18;
  
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  return (ulong)(local_18.tv_sec * 1000000 + local_18.tv_usec) / 1000;
}

Assistant:

uint64_t GetTimeMsec()
{
#ifdef _WIN32
    LARGE_INTEGER timeStamp = {};
    if (!::QueryPerformanceCounter(&timeStamp))
        return 0;
    if (PerfFrequencyInverseMsec == 0.)
        InitPerfFrequencyInverse();
    return (uint64_t)(PerfFrequencyInverseMsec * timeStamp.QuadPart);
#else
    // TBD: Optimize this?
    return GetTimeUsec() / 1000;
#endif
}